

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

string * __thiscall
TgBot::Api::downloadFile
          (string *__return_storage_ptr__,Api *this,string *filePath,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  HttpClient *pHVar1;
  string url;
  string sStack_e8;
  Url local_c8;
  
  std::__cxx11::string::string
            ((string *)&sStack_e8,"https://api.telegram.org/file/bot",(allocator *)&local_c8);
  std::__cxx11::string::append((string *)&sStack_e8);
  std::__cxx11::string::append((char *)&sStack_e8);
  std::__cxx11::string::append((string *)&sStack_e8);
  pHVar1 = this->_httpClient;
  Url::Url(&local_c8,&sStack_e8);
  (*pHVar1->_vptr_HttpClient[2])(__return_storage_ptr__,pHVar1,&local_c8,args);
  Url::~Url(&local_c8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  return __return_storage_ptr__;
}

Assistant:

string Api::downloadFile(const string& filePath, const std::vector<HttpReqArg>& args) const {
    string url = "https://api.telegram.org/file/bot";
    url += _token;
    url += "/";
    url += filePath;

    string serverResponse = _httpClient.makeRequest(url, args);

    return serverResponse;
}